

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

int cmSystemTools::WaitForLine
              (cmsysProcess *process,string *line,double timeout,
              vector<char,_std::allocator<char>_> *out,vector<char,_std::allocator<char>_> *err)

{
  double dVar1;
  bool bVar2;
  reference pcVar3;
  ulong uVar4;
  reference pvVar5;
  bool local_311;
  bool local_2f1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_2e8;
  const_iterator local_2e0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_2d8;
  const_iterator local_2d0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_2c8;
  char *local_2c0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_2b8;
  const_iterator local_2b0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_2a8;
  const_iterator local_2a0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_298;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_268;
  const_iterator local_260;
  size_type local_258;
  size_type size_3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_208;
  const_iterator local_200;
  size_type local_1f8;
  size_type size_2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_1a8;
  const_iterator local_1a0;
  size_type local_198;
  size_type size_1;
  char *local_188;
  char *local_180;
  char *local_178;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_168;
  const_iterator local_160;
  size_type local_158;
  size_type size;
  char *pcStack_148;
  int pipe;
  char *data;
  iterator iStack_138;
  int length;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_130;
  const_iterator local_128;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_120;
  const_iterator local_118;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_110;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_108;
  ulong local_100;
  size_type length_2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_f0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_e8;
  undefined4 local_dc;
  char *local_d8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_d0;
  const_iterator local_c8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_c0;
  const_iterator local_b8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_a0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_98;
  ulong local_90;
  size_type length_1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_80;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_78;
  undefined1 local_70 [8];
  string strdata;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Stack_48;
  cmProcessOutput processOutput;
  iterator erriter;
  iterator outiter;
  vector<char,_std::allocator<char>_> *err_local;
  vector<char,_std::allocator<char>_> *out_local;
  double timeout_local;
  string *line_local;
  cmsysProcess *process_local;
  
  out_local = (vector<char,_std::allocator<char>_> *)timeout;
  timeout_local = (double)line;
  line_local = (string *)process;
  std::__cxx11::string::operator=((string *)line,"");
  erriter = std::vector<char,_std::allocator<char>_>::begin(out);
  _Stack_48._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
  cmProcessOutput::cmProcessOutput
            ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),Auto,0x400);
  std::__cxx11::string::string((string *)local_70);
LAB_0070b6ea:
  do {
    local_78._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(out);
    bVar2 = __gnu_cxx::operator!=(&erriter,&local_78);
    if (bVar2) {
      pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&erriter);
      local_2f1 = false;
      if (*pcVar3 == '\r') {
        local_80 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator+(&erriter,1);
        length_1 = (size_type)std::vector<char,_std::allocator<char>_>::end(out);
        local_2f1 = __gnu_cxx::operator==
                              (&local_80,
                               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                *)&length_1);
      }
      if (local_2f1 == false) {
        pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&erriter);
        if ((*pcVar3 == '\n') ||
           (pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator*(&erriter), *pcVar3 == '\0')) {
          local_98._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
          local_90 = __gnu_cxx::operator-(&erriter,&local_98);
          bVar2 = false;
          if (1 < local_90) {
            local_a0 = __gnu_cxx::
                       __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator-(&erriter,1);
            pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator*(&local_a0);
            bVar2 = *pcVar3 == '\r';
          }
          dVar1 = timeout_local;
          if (bVar2) {
            local_90 = local_90 - 1;
          }
          if (local_90 != 0) {
            pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](out,0);
            std::__cxx11::string::append((char *)dVar1,(ulong)pvVar5);
          }
          local_c0._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_b8,&local_c0);
          local_d0 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                     ::operator+(&erriter,1);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_c8,&local_d0);
          local_d8 = (char *)std::vector<char,_std::allocator<char>_>::erase(out,local_b8,local_c8);
          process_local._4_4_ = 2;
          goto LAB_0070c236;
        }
        __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                  (&erriter);
        goto LAB_0070b6ea;
      }
    }
    while( true ) {
      local_e8._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(err);
      bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffffb8,&local_e8);
      if (!bVar2) break;
      pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&stack0xffffffffffffffb8);
      local_311 = false;
      if (*pcVar3 == '\r') {
        local_f0 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator+(&stack0xffffffffffffffb8,1);
        length_2 = (size_type)std::vector<char,_std::allocator<char>_>::end(err);
        local_311 = __gnu_cxx::operator==
                              (&local_f0,
                               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                *)&length_2);
      }
      if (local_311 != false) break;
      pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&stack0xffffffffffffffb8);
      if ((*pcVar3 == '\n') ||
         (pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*(&stack0xffffffffffffffb8), *pcVar3 == '\0')) {
        local_108._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
        local_100 = __gnu_cxx::operator-(&stack0xffffffffffffffb8,&local_108);
        bVar2 = false;
        if (1 < local_100) {
          local_110 = __gnu_cxx::
                      __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                      operator-(&stack0xffffffffffffffb8,1);
          pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*(&local_110);
          bVar2 = *pcVar3 == '\r';
        }
        dVar1 = timeout_local;
        if (bVar2) {
          local_100 = local_100 - 1;
        }
        if (local_100 != 0) {
          pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](err,0);
          std::__cxx11::string::append((char *)dVar1,(ulong)pvVar5);
        }
        local_120._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_118,&local_120);
        local_130 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                    ::operator+(&stack0xffffffffffffffb8,1);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_128,&local_130);
        iStack_138 = std::vector<char,_std::allocator<char>_>::erase(err,local_118,local_128);
        process_local._4_4_ = 3;
        goto LAB_0070c236;
      }
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                (&stack0xffffffffffffffb8);
    }
    size._4_4_ = cmsysProcess_WaitForData
                           ((cmsysProcess *)line_local,&stack0xfffffffffffffeb8,
                            (int *)((long)&data + 4),(double *)&out_local);
    if (size._4_4_ == 0xff) {
      process_local._4_4_ = 0xff;
      goto LAB_0070c236;
    }
    if (size._4_4_ == 2) {
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),pcStack_148,
                 (long)data._4_4_,(string *)local_70,1);
      local_158 = std::vector<char,_std::allocator<char>_>::size(out);
      local_168._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(out);
      __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
      __normal_iterator<char*>
                ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_160
                 ,&local_168);
      local_170._M_current = (char *)std::__cxx11::string::begin();
      local_178 = (char *)std::__cxx11::string::end();
      local_180 = (char *)std::vector<char,std::allocator<char>>::
                          insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                                    ((vector<char,std::allocator<char>> *)out,local_160,local_170,
                                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )local_178);
      size_1 = (size_type)std::vector<char,_std::allocator<char>_>::begin(out);
      local_188 = (char *)__gnu_cxx::
                          __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                          operator+((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                     *)&size_1,local_158);
      erriter._M_current = local_188;
    }
    else if (size._4_4_ == 3) {
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),pcStack_148,
                 (long)data._4_4_,(string *)local_70,2);
      local_198 = std::vector<char,_std::allocator<char>_>::size(err);
      local_1a8._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(err);
      __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
      __normal_iterator<char*>
                ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_1a0
                 ,&local_1a8);
      local_1b0._M_current = (char *)std::__cxx11::string::begin();
      local_1b8 = (char *)std::__cxx11::string::end();
      local_1c0 = (char *)std::vector<char,std::allocator<char>>::
                          insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                                    ((vector<char,std::allocator<char>> *)err,local_1a0,local_1b0,
                                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )local_1b8);
      local_1d0._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
      local_1c8 = (char *)__gnu_cxx::
                          __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                          operator+(&local_1d0,local_198);
      _Stack_48 = (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_1c8;
    }
    else if (size._4_4_ == 0) {
      std::__cxx11::string::string((string *)&size_2);
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),(string *)&size_2,
                 (string *)local_70,1);
      std::__cxx11::string::~string((string *)&size_2);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        local_1f8 = std::vector<char,_std::allocator<char>_>::size(out);
        local_208._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(out);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_200,&local_208);
        local_210._M_current = (char *)std::__cxx11::string::begin();
        local_218 = (char *)std::__cxx11::string::end();
        local_220 = (char *)std::vector<char,std::allocator<char>>::
                            insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                                      ((vector<char,std::allocator<char>> *)out,local_200,local_210,
                                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )local_218);
        local_230._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
        local_228 = (char *)__gnu_cxx::
                            __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                            operator+(&local_230,local_1f8);
        erriter._M_current = local_228;
      }
      std::__cxx11::string::string((string *)&size_3);
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),(string *)&size_3,
                 (string *)local_70,2);
      std::__cxx11::string::~string((string *)&size_3);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        local_258 = std::vector<char,_std::allocator<char>_>::size(err);
        local_268._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(err);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_260,&local_268);
        local_270._M_current = (char *)std::__cxx11::string::begin();
        local_278 = (char *)std::__cxx11::string::end();
        local_280 = (char *)std::vector<char,std::allocator<char>>::
                            insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                                      ((vector<char,std::allocator<char>> *)err,local_260,local_270,
                                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )local_278);
        local_290._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
        local_288 = (char *)__gnu_cxx::
                            __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                            operator+(&local_290,local_258);
        _Stack_48 = (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_288;
      }
      bVar2 = std::vector<char,_std::allocator<char>_>::empty(out);
      dVar1 = timeout_local;
      if (bVar2) {
        bVar2 = std::vector<char,_std::allocator<char>_>::empty(err);
        dVar1 = timeout_local;
        if (bVar2) {
          process_local._4_4_ = 0;
        }
        else {
          pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](err,0);
          local_2c8._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
          __gnu_cxx::operator-(&stack0xffffffffffffffb8,&local_2c8);
          std::__cxx11::string::append((char *)dVar1,(ulong)pvVar5);
          local_2d8._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(err);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_2d0,&local_2d8);
          local_2e8._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(err);
          __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
          __normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                     &local_2e0,&local_2e8);
          std::vector<char,_std::allocator<char>_>::erase(err,local_2d0,local_2e0);
          process_local._4_4_ = 3;
        }
      }
      else {
        pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](out,0);
        local_298._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
        __gnu_cxx::operator-(&erriter,&local_298);
        std::__cxx11::string::append((char *)dVar1,(ulong)pvVar5);
        local_2a8._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(out);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_2a0,&local_2a8);
        local_2b8._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(out);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_2b0,&local_2b8);
        local_2c0 = (char *)std::vector<char,_std::allocator<char>_>::erase(out,local_2a0,local_2b0)
        ;
        process_local._4_4_ = 2;
      }
LAB_0070c236:
      local_dc = 1;
      std::__cxx11::string::~string((string *)local_70);
      cmProcessOutput::~cmProcessOutput((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf));
      return process_local._4_4_;
    }
  } while( true );
}

Assistant:

int cmSystemTools::WaitForLine(cmsysProcess* process, std::string& line,
                               double timeout, std::vector<char>& out,
                               std::vector<char>& err)
{
  line = "";
  std::vector<char>::iterator outiter = out.begin();
  std::vector<char>::iterator erriter = err.begin();
  cmProcessOutput processOutput;
  std::string strdata;
  while (true) {
    // Check for a newline in stdout.
    for (; outiter != out.end(); ++outiter) {
      if ((*outiter == '\r') && ((outiter + 1) == out.end())) {
        break;
      }
      if (*outiter == '\n' || *outiter == '\0') {
        std::vector<char>::size_type length = outiter - out.begin();
        if (length > 1 && *(outiter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(&out[0], length);
        }
        out.erase(out.begin(), outiter + 1);
        return cmsysProcess_Pipe_STDOUT;
      }
    }

    // Check for a newline in stderr.
    for (; erriter != err.end(); ++erriter) {
      if ((*erriter == '\r') && ((erriter + 1) == err.end())) {
        break;
      }
      if (*erriter == '\n' || *erriter == '\0') {
        std::vector<char>::size_type length = erriter - err.begin();
        if (length > 1 && *(erriter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(&err[0], length);
        }
        err.erase(err.begin(), erriter + 1);
        return cmsysProcess_Pipe_STDERR;
      }
    }

    // No newlines found.  Wait for more data from the process.
    int length;
    char* data;
    int pipe = cmsysProcess_WaitForData(process, &data, &length, &timeout);
    if (pipe == cmsysProcess_Pipe_Timeout) {
      // Timeout has been exceeded.
      return pipe;
    }
    if (pipe == cmsysProcess_Pipe_STDOUT) {
      processOutput.DecodeText(data, length, strdata, 1);
      // Append to the stdout buffer.
      std::vector<char>::size_type size = out.size();
      out.insert(out.end(), strdata.begin(), strdata.end());
      outiter = out.begin() + size;
    } else if (pipe == cmsysProcess_Pipe_STDERR) {
      processOutput.DecodeText(data, length, strdata, 2);
      // Append to the stderr buffer.
      std::vector<char>::size_type size = err.size();
      err.insert(err.end(), strdata.begin(), strdata.end());
      erriter = err.begin() + size;
    } else if (pipe == cmsysProcess_Pipe_None) {
      // Both stdout and stderr pipes have broken.  Return leftover data.
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = out.size();
        out.insert(out.end(), strdata.begin(), strdata.end());
        outiter = out.begin() + size;
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = err.size();
        err.insert(err.end(), strdata.begin(), strdata.end());
        erriter = err.begin() + size;
      }
      if (!out.empty()) {
        line.append(&out[0], outiter - out.begin());
        out.erase(out.begin(), out.end());
        return cmsysProcess_Pipe_STDOUT;
      }
      if (!err.empty()) {
        line.append(&err[0], erriter - err.begin());
        err.erase(err.begin(), err.end());
        return cmsysProcess_Pipe_STDERR;
      }
      return cmsysProcess_Pipe_None;
    }
  }
}